

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool __thiscall
libaom_examples::anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_short>
          (ParsedValue *this,int64_t min,int64_t max,int line_idx,unsigned_short *v)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  undefined2 *in_R8;
  
  iVar1 = *in_RDI;
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      if ((in_RSI <= *(long *)(in_RDI + 2)) && (*(long *)(in_RDI + 2) <= in_RDX)) {
        *in_R8 = (short)*(undefined8 *)(in_RDI + 2);
        return true;
      }
      fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",
              *(undefined8 *)(in_RDI + 2),in_RSI,in_RDX,(ulong)in_ECX);
      return false;
    }
    if (iVar1 == 2) {
      fprintf(_stderr,"Floating point value found where integer was expected at line %d\n",
              (ulong)in_ECX);
      return false;
    }
  }
  fprintf(_stderr,"No value found where integer was expected at line %d\n",(ulong)in_ECX);
  return false;
}

Assistant:

bool IntegerValueInRange(int64_t min, int64_t max, int line_idx, T *v) {
    switch (type_) {
      case Type::kInteger:
        if (int_value_ < min || int_value_ > max) {
          fprintf(stderr,
                  "Integer value %" PRId64 " out of range [%" PRId64
                  ", %" PRId64 "] at line %d\n",
                  int_value_, min, max, line_idx);
          return false;
        }
        *v = static_cast<T>(int_value_);
        return true;
      case Type::kFloatingPoint:
        fprintf(stderr,
                "Floating point value found where integer was expected at line "
                "%d\n",
                line_idx);
        return false;
      case Type::kNone:
      default:
        fprintf(stderr,
                "No value found where integer was expected at line %d\n",
                line_idx);
        return false;
    }
  }